

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
parse_query_item(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  bool bVar4;
  curi_status cVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  sVar3 = *offset;
  cVar1 = settings->query_item_separator;
  uVar9 = sVar3;
  do {
    uVar8 = uVar9;
    pcVar7 = uri + uVar8;
    if (len <= uVar8) {
      pcVar7 = "";
    }
    uVar9 = uVar8 + 1;
    *offset = uVar9;
    cVar2 = *pcVar7;
    if ((cVar2 == cVar1) || (cVar2 == settings->query_item_key_separator))
    goto switchD_00102f46_caseD_22;
    bVar4 = true;
    switch(cVar2) {
    case '!':
    case '$':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
    case '-':
    case '.':
    case '/':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case ':':
    case ';':
    case '=':
    case '?':
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '_':
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
    case '~':
      break;
    case '%':
      pcVar7 = uri + uVar9;
      if (len <= uVar9) {
        pcVar7 = "";
      }
      uVar9 = uVar8 + 2;
      *offset = uVar9;
      if (((byte)*pcVar7 - 0x30 < 0x37) &&
         ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar7 - 0x30) & 0x3f) & 1) != 0)) {
        pcVar7 = uri + uVar9;
        if (len <= uVar9) {
          pcVar7 = "";
        }
        uVar9 = uVar8 + 3;
        *offset = uVar9;
        if (((byte)*pcVar7 - 0x30 < 0x37) &&
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar7 - 0x30) & 0x3f) & 1) != 0)) break;
      }
    default:
switchD_00102f46_caseD_22:
      bVar4 = false;
    }
  } while (bVar4);
  *offset = uVar8;
  uVar9 = *offset;
  cVar1 = settings->query_item_key_separator;
  pcVar7 = uri + uVar9;
  if (len <= uVar9) {
    pcVar7 = "";
  }
  sVar6 = uVar9 + 1;
  *offset = sVar6;
  if (*pcVar7 == cVar1) {
    cVar1 = settings->query_item_separator;
    uVar8 = *offset;
    do {
      uVar10 = uVar8;
      pcVar7 = uri + uVar10;
      if (len <= uVar10) {
        pcVar7 = "";
      }
      uVar8 = uVar10 + 1;
      *offset = uVar8;
      if (*pcVar7 == cVar1) {
switchD_00103010_caseD_22:
        bVar4 = false;
      }
      else {
        bVar4 = true;
        switch(*pcVar7) {
        case '!':
        case '$':
        case '&':
        case '\'':
        case '(':
        case ')':
        case '*':
        case '+':
        case ',':
        case '-':
        case '.':
        case '/':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
        case ':':
        case ';':
        case '=':
        case '?':
        case '@':
        case 'A':
        case 'B':
        case 'C':
        case 'D':
        case 'E':
        case 'F':
        case 'G':
        case 'H':
        case 'I':
        case 'J':
        case 'K':
        case 'L':
        case 'M':
        case 'N':
        case 'O':
        case 'P':
        case 'Q':
        case 'R':
        case 'S':
        case 'T':
        case 'U':
        case 'V':
        case 'W':
        case 'X':
        case 'Y':
        case 'Z':
        case '_':
        case 'a':
        case 'b':
        case 'c':
        case 'd':
        case 'e':
        case 'f':
        case 'g':
        case 'h':
        case 'i':
        case 'j':
        case 'k':
        case 'l':
        case 'm':
        case 'n':
        case 'o':
        case 'p':
        case 'q':
        case 'r':
        case 's':
        case 't':
        case 'u':
        case 'v':
        case 'w':
        case 'x':
        case 'y':
        case 'z':
        case '~':
          break;
        default:
          goto switchD_00103010_caseD_22;
        case '%':
          pcVar7 = uri + uVar8;
          if (len <= uVar8) {
            pcVar7 = "";
          }
          uVar8 = uVar10 + 2;
          *offset = uVar8;
          if (0x36 < (byte)*pcVar7 - 0x30) goto switchD_00103010_caseD_22;
          if ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar7 - 0x30) & 0x3f) & 1) != 0) {
            pcVar7 = uri + uVar8;
            if (len <= uVar8) {
              pcVar7 = "";
            }
            uVar8 = uVar10 + 3;
            *offset = uVar8;
            if (((byte)*pcVar7 - 0x30 < 0x37) &&
               ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar7 - 0x30) & 0x3f) & 1) != 0)) break;
          }
          bVar4 = false;
        }
      }
    } while (bVar4);
    *offset = uVar10;
    pcVar7 = uri + sVar6;
    sVar6 = *offset - sVar6;
  }
  else {
    *offset = uVar9;
    pcVar7 = (char *)0x0;
    sVar6 = 0;
  }
  cVar5 = handle_query_item(uri + sVar3,uVar9 - sVar3,pcVar7,sVar6,settings,userData);
  return cVar5;
}

Assistant:

static curi_status parse_query_item(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // query_item = query_item_key [query_item_key_separator query_item_value]
    // query_item_key = *query_fragment_char (but no query_item_separator or query_item_key_separator)
    // query_item_separator = settings->query_item_separator (default is "&")
    // query_item_key_separator = settings->query_item_key_separator (default is "=")
    // query_item_value = *query_fragment_char (but no query_item_separator)

    const size_t keyStartOffset = *offset;
    size_t keyEndOffset;

    curi_status status = curi_status_success;
    while (status == curi_status_success)
    {
        size_t previousOffset = *offset;

        char c = *read_char(uri, len, offset);
        if (c == settings->query_item_separator)
            status = curi_status_error;
        else if (c == settings->query_item_key_separator)
            status = curi_status_error;
        else
        {
            switch (c)
            {
                CASE_QUERY_FRAGMENT_CHAR_NO_PCT:
                    status = curi_status_success;
                    break;
                case '%':
                    status = parse_h8(uri, len, offset, settings, userData);
                    break;
                default:
                    status = curi_status_error;
                    break;
            }
        }

        if (status != curi_status_success)
            *offset = previousOffset;
    };

    keyEndOffset = *offset;

    status = parse_char(settings->query_item_key_separator, uri, len, offset, settings, userData);

    if (status == curi_status_success)
    {
        // There is a value
        const size_t valueStartOffset = *offset;

        while (status == curi_status_success)
        {
            size_t previousOffset = *offset;

            char c = *read_char(uri, len, offset);
            if (c == settings->query_item_separator)
                status = curi_status_error;
            else
            {
                switch (c)
                {
                    CASE_QUERY_FRAGMENT_CHAR_NO_PCT:
                        status = curi_status_success;
                        break;
                    case '%':
                        status = parse_h8(uri, len, offset, settings, userData);
                        break;
                    default:
                        status = curi_status_error;
                        break;
                }
            }

            if (status != curi_status_success)
                *offset = previousOffset;
        }

        status = handle_query_item(uri + keyStartOffset, keyEndOffset - keyStartOffset, uri + valueStartOffset, *offset - valueStartOffset, settings, userData);
    }
    else
    {
        *offset = keyEndOffset;
        // There is no value
        status = handle_query_item(uri + keyStartOffset, keyEndOffset - keyStartOffset, 0, 0, settings, userData);
    }

    return status;
}